

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::SSLClient::connect_with_proxy
          (SSLClient *this,Socket *socket,Response *res,bool *success,Error *error)

{
  socket_t sVar1;
  time_t tVar2;
  time_t tVar3;
  time_t tVar4;
  time_t tVar5;
  bool bVar6;
  bool bVar7;
  function<bool_(httplib::Stream_&)> local_2d0;
  function<bool_(httplib::Stream_&)> local_2b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  Response res2;
  Response res3;
  anon_class_32_4_86ec7540 local_50;
  
  *success = true;
  res2.version._M_dataplus._M_p = (pointer)&res2.version.field_2;
  res2.version._M_string_length = 0;
  res2.version.field_2._M_local_buf[0] = '\0';
  res2.status = -1;
  res2.reason._M_dataplus._M_p = (pointer)&res2.reason.field_2;
  res2.reason._M_string_length = 0;
  res2.reason.field_2._M_local_buf[0] = '\0';
  res2.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &res2.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  res2.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  res2.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  res2.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  res2.body._M_dataplus._M_p = (pointer)&res2.body.field_2;
  res2.body._M_string_length = 0;
  res2.body.field_2._M_local_buf[0] = '\0';
  res2.location._M_dataplus._M_p = (pointer)&res2.location.field_2;
  res2.location._M_string_length = 0;
  res2.location.field_2._M_local_buf[0] = '\0';
  res2.content_length_ = 0;
  res2.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  res2.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  res2.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
  res2.content_provider_._M_invoker = (_Invoker_type)0x0;
  res2.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  res2.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
  res2.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
  res2.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
  res2.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
  res2._250_8_ = 0;
  sVar1 = socket->sock;
  tVar2 = (this->super_ClientImpl).read_timeout_sec_;
  tVar3 = (this->super_ClientImpl).read_timeout_usec_;
  tVar4 = (this->super_ClientImpl).write_timeout_sec_;
  tVar5 = (this->super_ClientImpl).write_timeout_usec_;
  res3.version._M_string_length = (size_type)&res2;
  res2.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       res2.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  res3.version._M_dataplus._M_p = (pointer)this;
  res3.version.field_2._M_allocated_capacity = (size_type)error;
  std::function<bool(httplib::Stream&)>::
  function<httplib::SSLClient::connect_with_proxy(httplib::ClientImpl::Socket&,httplib::Response&,bool&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
            ((function<bool(httplib::Stream&)> *)&local_2b0,(anon_class_24_3_cc83523b *)&res3);
  bVar6 = detail::process_client_socket(sVar1,tVar2,tVar3,tVar4,tVar5,&local_2b0);
  std::_Function_base::~_Function_base(&local_2b0.super__Function_base);
  if (bVar6) {
    bVar6 = true;
    if (res2.status != 0x197) goto LAB_001320b0;
    if (((this->super_ClientImpl).proxy_digest_auth_username_._M_string_length != 0) &&
       ((this->super_ClientImpl).proxy_digest_auth_password_._M_string_length != 0)) {
      auth._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &auth._M_t._M_impl.super__Rb_tree_header._M_header;
      auth._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      auth._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      auth._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      auth._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           auth._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar7 = detail::parse_www_authenticate(&res2,&auth,true);
      if (bVar7) {
        res3.version._M_dataplus._M_p = (pointer)&res3.version.field_2;
        res3.version._M_string_length = 0;
        res3.version.field_2._M_allocated_capacity =
             res3.version.field_2._M_allocated_capacity & 0xffffffffffffff00;
        res3.status = -1;
        res3.reason._M_dataplus._M_p = (pointer)&res3.reason.field_2;
        res3.reason._M_string_length = 0;
        res3.reason.field_2._M_local_buf[0] = '\0';
        res3.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &res3.headers._M_t._M_impl.super__Rb_tree_header._M_header;
        res3.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        res3.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        res3.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        res3.body._M_dataplus._M_p = (pointer)&res3.body.field_2;
        res3.body._M_string_length = 0;
        res3.body.field_2._M_local_buf[0] = '\0';
        res3.location._M_dataplus._M_p = (pointer)&res3.location.field_2;
        res3.location._M_string_length = 0;
        res3.location.field_2._M_local_buf[0] = '\0';
        res3.content_length_ = 0;
        res3.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
        res3.content_provider_.super__Function_base._M_functor._8_8_ = 0;
        res3.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
        res3.content_provider_._M_invoker = (_Invoker_type)0x0;
        res3.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused._M_object
             = (void *)0x0;
        res3.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
        res3.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
        res3.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
        res3.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
        res3._250_8_ = 0;
        sVar1 = socket->sock;
        tVar2 = (this->super_ClientImpl).read_timeout_sec_;
        tVar3 = (this->super_ClientImpl).read_timeout_usec_;
        tVar4 = (this->super_ClientImpl).write_timeout_sec_;
        tVar5 = (this->super_ClientImpl).write_timeout_usec_;
        local_50.res3 = &res3;
        res3.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             res3.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_50.this = this;
        local_50.auth = &auth;
        local_50.error = error;
        std::function<bool(httplib::Stream&)>::
        function<httplib::SSLClient::connect_with_proxy(httplib::ClientImpl::Socket&,httplib::Response&,bool&,httplib::Error&)::_lambda(httplib::Stream&)_2_,void>
                  ((function<bool(httplib::Stream&)> *)&local_2d0,&local_50);
        bVar7 = detail::process_client_socket(sVar1,tVar2,tVar3,tVar4,tVar5,&local_2d0);
        std::_Function_base::~_Function_base(&local_2d0.super__Function_base);
        if (!bVar7) {
          (*(this->super_ClientImpl)._vptr_ClientImpl[4])(this,socket,1);
          ClientImpl::shutdown_socket(&this->super_ClientImpl,socket);
          ClientImpl::close_socket(&this->super_ClientImpl,socket);
          *success = false;
          Response::~Response(&res3);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&auth._M_t);
          goto LAB_001320ae;
        }
        Response::~Response(&res3);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&auth._M_t);
      goto LAB_001320b0;
    }
    Response::operator=(res,&res2);
  }
  else {
    (*(this->super_ClientImpl)._vptr_ClientImpl[4])(this,socket,1);
    ClientImpl::shutdown_socket(&this->super_ClientImpl,socket);
    ClientImpl::close_socket(&this->super_ClientImpl,socket);
    *success = false;
  }
LAB_001320ae:
  bVar6 = false;
LAB_001320b0:
  Response::~Response(&res2);
  return bVar6;
}

Assistant:

inline bool SSLClient::connect_with_proxy(Socket &socket, Response &res,
                                          bool &success, Error &error) {
  success = true;
  Response res2;
  if (!detail::process_client_socket(
          socket.sock, read_timeout_sec_, read_timeout_usec_,
          write_timeout_sec_, write_timeout_usec_, [&](Stream &strm) {
            Request req2;
            req2.method = "CONNECT";
            req2.path = host_and_port_;
            return process_request(strm, req2, res2, false, error);
          })) {
    // Thread-safe to close everything because we are assuming there are no
    // requests in flight
    shutdown_ssl(socket, true);
    shutdown_socket(socket);
    close_socket(socket);
    success = false;
    return false;
  }

  if (res2.status == 407) {
    if (!proxy_digest_auth_username_.empty() &&
        !proxy_digest_auth_password_.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res2, auth, true)) {
        Response res3;
        if (!detail::process_client_socket(
                socket.sock, read_timeout_sec_, read_timeout_usec_,
                write_timeout_sec_, write_timeout_usec_, [&](Stream &strm) {
                  Request req3;
                  req3.method = "CONNECT";
                  req3.path = host_and_port_;
                  req3.headers.insert(detail::make_digest_authentication_header(
                      req3, auth, 1, detail::random_string(10),
                      proxy_digest_auth_username_, proxy_digest_auth_password_,
                      true));
                  return process_request(strm, req3, res3, false, error);
                })) {
          // Thread-safe to close everything because we are assuming there are
          // no requests in flight
          shutdown_ssl(socket, true);
          shutdown_socket(socket);
          close_socket(socket);
          success = false;
          return false;
        }
      }
    } else {
      res = res2;
      return false;
    }
  }

  return true;
}